

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LabText.h
# Opt level: O2

char * tsGetTokenAlphaNumericExt
                 (char *pCurr,char *pEnd,char *ext_,char **resultStringBegin,uint32_t *stringLength)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  uint32_t uVar4;
  bool bVar5;
  byte *pbVar6;
  
  pbVar3 = (byte *)tsScanForNonWhiteSpace(pCurr,pEnd);
  *resultStringBegin = (char *)pbVar3;
  uVar4 = 0;
  while( true ) {
    *stringLength = uVar4;
    if (pEnd <= pbVar3) {
      return (char *)pbVar3;
    }
    bVar1 = *pbVar3;
    if (((ulong)bVar1 < 0x21) && ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) break;
    bVar5 = (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a || (byte)(bVar1 - 0x30) < 10;
    pbVar6 = (byte *)ext_;
    while ((bVar2 = *pbVar6, bVar2 != 0 && (!bVar5))) {
      pbVar6 = pbVar6 + 1;
      bVar5 = bVar2 == bVar1;
    }
    if (!bVar5) {
      return (char *)pbVar3;
    }
    pbVar3 = pbVar3 + 1;
    uVar4 = uVar4 + 1;
  }
  return (char *)pbVar3;
}

Assistant:

char const* tsGetTokenAlphaNumericExt(
    char const* pCurr, char const* pEnd,
    char const* ext_,
    char const** resultStringBegin, uint32_t* stringLength)
{
    Assert(pCurr && pEnd);

    pCurr = tsScanForNonWhiteSpace(pCurr, pEnd);
    *resultStringBegin = pCurr;
    *stringLength = 0;

    while (pCurr < pEnd)
    {
        char test = pCurr[0];

        if (tsIsWhiteSpace(test))
            break;

        _Bool accept = tsIsNumeric(test) || tsIsAlpha(test);
        char const* ext = ext_;
        for ( ; *ext && !accept; ++ext)
            accept |= *ext == test;

        if (!accept)
            break;

        ++pCurr;
        *stringLength += 1;
    }

    return pCurr;
}